

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O2

void __thiscall arangodb::velocypack::Dumper::indent(Dumper *this)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = (long)this->_indentation;
  (*this->_sink->_vptr_Sink[4])(this->_sink,lVar1 * 2);
  while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    (*this->_sink->_vptr_Sink[3])(this->_sink,"  ",2);
  }
  return;
}

Assistant:

void Dumper::indent() {
  std::size_t n = _indentation;
  _sink->reserve(2 * n);
  for (std::size_t i = 0; i < n; ++i) {
    _sink->append("  ", 2);
  }
}